

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall wasm::OptimizeAddedConstants::cleanUpAfterPropagation(OptimizeAddedConstants *this)

{
  Function *func;
  PassOptions *passOptions;
  Module *module;
  undefined1 local_108 [8];
  UnneededSetRemover remover;
  OptimizeAddedConstants *this_local;
  
  remover._240_8_ = this;
  func = Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
         ::getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                        .
                        super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                      );
  passOptions = Pass::getPassOptions((Pass *)this);
  module = Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
           ::getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                        .
                        super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                      );
  UnneededSetRemover::UnneededSetRemover((UnneededSetRemover *)local_108,func,passOptions,module);
  UnneededSetRemover::~UnneededSetRemover((UnneededSetRemover *)local_108);
  return;
}

Assistant:

void cleanUpAfterPropagation() {
    // Remove sets that no longer have uses. This allows further propagation by
    // letting us see the accurate amount of uses of each set.
    UnneededSetRemover remover(getFunction(), getPassOptions(), *getModule());
  }